

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void av1_cnn_convolve_no_maxpool_padding_valid_c
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int ii;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  
  iVar1 = layer_config->out_channels;
  for (lVar14 = (long)start_idx; lVar14 < iVar1; lVar14 = lVar14 + channel_step) {
    iVar2 = layer_config->filter_height;
    iVar5 = 0;
    for (iVar7 = 0; iVar7 <= in_height - iVar2; iVar7 = iVar7 + layer_config->skip_height) {
      lVar9 = (long)iVar5;
      iVar3 = layer_config->filter_width;
      for (iVar11 = 0; iVar11 <= in_width - iVar3; iVar11 = iVar11 + layer_config->skip_width) {
        fVar15 = layer_config->bias[lVar14];
        uVar4 = layer_config->in_channels;
        if (layer_config->in_channels < 1) {
          uVar4 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
          lVar10 = uVar8 * (long)iVar1 + lVar14;
          lVar13 = (long)in_stride * 4 * (long)iVar7;
          for (lVar12 = (long)iVar7; lVar12 < iVar2 + iVar7; lVar12 = lVar12 + 1) {
            lVar10 = (long)(int)lVar10;
            for (lVar6 = (long)iVar11; lVar6 < iVar3 + iVar11; lVar6 = lVar6 + 1) {
              fVar15 = fVar15 + layer_config->weights[lVar10] *
                                *(float *)((long)input[uVar8] + lVar6 * 4 + lVar13);
              lVar10 = lVar10 + cstep;
            }
            lVar13 = lVar13 + (long)in_stride * 4;
          }
        }
        output[lVar14][lVar9] = fVar15;
        lVar9 = lVar9 + 1;
      }
      iVar5 = iVar5 + out_stride;
    }
  }
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_c(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  assert((layer_config->skip_height == 1 && layer_config->skip_width == 1) ||
         !layer_config->maxpool);
  assert(layer_config->filter_height > 1 || layer_config->filter_width > 1);
  assert(layer_config->pad == PADDING_VALID);
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    for (int h = 0, u = 0; h < in_height - layer_config->filter_height + 1;
         h += layer_config->skip_height, ++u) {
      const int out_h = u * out_stride;
      const int upper_ii_index = layer_config->filter_height + h;
      for (int w = 0, out_index = out_h;
           w < in_width - layer_config->filter_width + 1;
           w += layer_config->skip_width, ++out_index) {
        const int upper_jj_index = layer_config->filter_width + w;
        float sum = layer_config->bias[i];
        for (int k = 0; k < layer_config->in_channels; ++k) {
          int off = k * layer_config->out_channels + i;
          for (int ii = h; ii < upper_ii_index; ++ii) {
            for (int jj = w; jj < upper_jj_index; ++jj) {
              assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
              sum += layer_config->weights[off] * input[k][ii * in_stride + jj];
              off += cstep;
            }
          }
        }
        output[i][out_index] = sum;
      }
    }
  }
}